

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# City.cpp
# Opt level: O2

uint128 CityHashCrc128WithSeed(char *s,size_t len,uint128 seed)

{
  uint64 uVar1;
  uint64 uVar2;
  ulong uVar3;
  uint128 uVar4;
  uint64 result [4];
  uint64 local_48;
  long local_40;
  long local_38;
  long local_30;
  
  if (len < 0x385) {
    uVar4 = CityHash128WithSeed(s,len,seed);
  }
  else {
    CityHashCrc256(s,len,&local_48);
    uVar3 = seed.first + local_40;
    uVar2 = seed.second + local_48;
    uVar1 = HashLen16(uVar2,local_38 + uVar3);
    uVar2 = HashLen16(uVar3 >> 0x20 | uVar3 << 0x20,uVar2 * -0x3c5a37a36834ced9 + local_30);
    uVar4.second = uVar2;
    uVar4.first = uVar1;
  }
  return uVar4;
}

Assistant:

uint128 CityHashCrc128WithSeed(const char *s, size_t len, uint128 seed) {
  if (len <= 900) {
    return CityHash128WithSeed(s, len, seed);
  } else {
    uint64 result[4];
    CityHashCrc256(s, len, result);
    uint64 u = Uint128High64(seed) + result[0];
    uint64 v = Uint128Low64(seed) + result[1];
    return uint128(HashLen16(u, v + result[2]),
                   HashLen16(Rotate(v, 32), u * k0 + result[3]));
  }
}